

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase471::run(TestCase471 *this)

{
  Builder value;
  Builder value_00;
  Builder value_01;
  Builder value_02;
  Builder value_03;
  Builder value_04;
  Builder value_05;
  Builder value_06;
  Builder value_07;
  Builder value_08;
  Builder value_09;
  Builder value_10;
  Builder value_11;
  Builder value_12;
  Builder value_13;
  Builder value_14;
  Builder value_15;
  Builder value_16;
  Builder value_17;
  Builder value_18;
  size_t sVar1;
  Branch *pBVar2;
  ulong uVar3;
  anon_union_8_2_eba6ea51_for_Type_5 aVar4;
  ListSchema LVar5;
  initializer_list<int> value_19;
  initializer_list<int> value_20;
  initializer_list<int> value_21;
  Reader value_22;
  Reader value_23;
  Reader value_24;
  Reader value_25;
  Reader value_26;
  Reader value_27;
  Builder l8;
  DebugComparison<const_char_(&)[149],_kj::String> _kjCondition;
  Builder root;
  Builder list;
  MallocMessageBuilder builder;
  undefined8 uVar6;
  char *pcVar7;
  char *pcVar8;
  SegmentBuilder *pSVar9;
  String *pSVar10;
  SegmentBuilder *pSVar11;
  undefined2 *puVar12;
  byte *pbVar13;
  undefined8 uVar14;
  StringTree local_628;
  SegmentBuilder *local_5e8;
  CapTableBuilder *in_stack_fffffffffffffa20;
  CapTableBuilder *pCVar15;
  CapTableBuilder *pCVar16;
  ArrayDisposer *in_stack_fffffffffffffa28;
  undefined8 in_stack_fffffffffffffa30;
  WirePointer *pWVar17;
  undefined8 in_stack_fffffffffffffa38;
  undefined8 in_stack_fffffffffffffa40;
  SegmentBuilder *pSVar18;
  CapTableBuilder *pCVar19;
  CapTableBuilder *pCVar20;
  WirePointer *pWVar21;
  WirePointer *pWVar22;
  WirePointer *pWVar23;
  WirePointer *in_stack_fffffffffffffa60;
  WirePointer *pWVar24;
  char *local_598;
  bool local_588;
  StructBuilder local_578;
  String local_548;
  undefined1 local_528 [48];
  char *local_4f8;
  ulong local_4f0;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_4e8;
  SegmentBuilder *local_4e0;
  CapTableBuilder *pCStack_4d8;
  byte *local_4d0;
  WirePointer *pWStack_4c8;
  StructDataBitCount local_4c0;
  StructPointerCount SStack_4bc;
  ElementSize EStack_4ba;
  undefined1 uStack_4b9;
  ulong local_4b8;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_4b0;
  SegmentBuilder *local_4a8;
  CapTableBuilder *pCStack_4a0;
  byte *local_498;
  WirePointer *pWStack_490;
  StructDataBitCount local_488;
  StructPointerCount SStack_484;
  ElementSize EStack_482;
  undefined1 uStack_481;
  undefined8 local_480;
  SegmentBuilder *pSStack_478;
  CapTableBuilder *pCStack_470;
  undefined2 *puStack_468;
  WirePointer *pWStack_460;
  StructDataBitCount local_458;
  StructPointerCount SStack_454;
  undefined2 uStack_452;
  undefined8 local_450;
  SegmentBuilder *pSStack_448;
  CapTableBuilder *pCStack_440;
  undefined2 *puStack_438;
  WirePointer *pWStack_430;
  StructDataBitCount local_428;
  StructPointerCount SStack_424;
  undefined2 uStack_422;
  undefined8 local_420;
  SegmentBuilder *pSStack_418;
  CapTableBuilder *pCStack_410;
  undefined2 *puStack_408;
  WirePointer *pWStack_400;
  StructDataBitCount local_3f8;
  StructPointerCount SStack_3f4;
  undefined2 uStack_3f2;
  undefined8 local_3f0;
  SegmentBuilder *pSStack_3e8;
  CapTableBuilder *pCStack_3e0;
  undefined2 *puStack_3d8;
  WirePointer *pWStack_3d0;
  StructDataBitCount local_3c8;
  StructPointerCount SStack_3c4;
  undefined2 uStack_3c2;
  undefined8 local_3c0;
  SegmentBuilder *pSStack_3b8;
  CapTableBuilder *pCStack_3b0;
  undefined2 *puStack_3a8;
  WirePointer *pWStack_3a0;
  StructDataBitCount local_398;
  StructPointerCount SStack_394;
  undefined2 uStack_392;
  undefined8 local_390;
  SegmentBuilder *pSStack_388;
  CapTableBuilder *pCStack_380;
  undefined2 *puStack_378;
  WirePointer *pWStack_370;
  StructDataBitCount local_368;
  StructPointerCount SStack_364;
  undefined2 uStack_362;
  undefined8 local_360;
  SegmentBuilder *pSStack_358;
  CapTableBuilder *pCStack_350;
  undefined2 *puStack_348;
  WirePointer *pWStack_340;
  StructDataBitCount local_338;
  StructPointerCount SStack_334;
  undefined2 uStack_332;
  undefined8 local_330;
  SegmentBuilder *pSStack_328;
  CapTableBuilder *pCStack_320;
  undefined2 *puStack_318;
  WirePointer *pWStack_310;
  StructDataBitCount local_308;
  StructPointerCount SStack_304;
  undefined2 uStack_302;
  undefined8 local_300;
  SegmentBuilder *pSStack_2f8;
  CapTableBuilder *pCStack_2f0;
  undefined2 *puStack_2e8;
  WirePointer *pWStack_2e0;
  StructDataBitCount local_2d8;
  StructPointerCount SStack_2d4;
  undefined2 uStack_2d2;
  undefined8 local_2d0;
  SegmentBuilder *pSStack_2c8;
  CapTableBuilder *pCStack_2c0;
  undefined2 *puStack_2b8;
  WirePointer *pWStack_2b0;
  StructDataBitCount local_2a8;
  StructPointerCount SStack_2a4;
  undefined2 uStack_2a2;
  undefined8 local_2a0;
  SegmentBuilder *pSStack_298;
  CapTableBuilder *pCStack_290;
  undefined2 *puStack_288;
  WirePointer *pWStack_280;
  StructDataBitCount local_278;
  StructPointerCount SStack_274;
  undefined2 uStack_272;
  undefined8 local_270;
  SegmentBuilder *pSStack_268;
  CapTableBuilder *pCStack_260;
  undefined2 *puStack_258;
  WirePointer *pWStack_250;
  StructDataBitCount local_248;
  StructPointerCount SStack_244;
  undefined2 uStack_242;
  undefined8 local_240;
  SegmentBuilder *pSStack_238;
  CapTableBuilder *pCStack_230;
  undefined2 *puStack_228;
  WirePointer *pWStack_220;
  StructDataBitCount local_218;
  StructPointerCount SStack_214;
  undefined2 uStack_212;
  undefined8 local_210;
  SegmentBuilder *pSStack_208;
  CapTableBuilder *pCStack_200;
  undefined2 *puStack_1f8;
  WirePointer *pWStack_1f0;
  StructDataBitCount local_1e8;
  StructPointerCount SStack_1e4;
  undefined2 uStack_1e2;
  undefined8 local_1e0;
  SegmentBuilder *pSStack_1d8;
  CapTableBuilder *pCStack_1d0;
  undefined2 *puStack_1c8;
  WirePointer *pWStack_1c0;
  StructDataBitCount local_1b8;
  StructPointerCount SStack_1b4;
  undefined2 uStack_1b2;
  undefined8 local_1b0;
  SegmentBuilder *pSStack_1a8;
  CapTableBuilder *pCStack_1a0;
  undefined2 *puStack_198;
  WirePointer *pWStack_190;
  StructDataBitCount local_188;
  StructPointerCount SStack_184;
  undefined2 uStack_182;
  undefined8 local_180;
  SegmentBuilder *pSStack_178;
  CapTableBuilder *pCStack_170;
  undefined2 *puStack_168;
  WirePointer *pWStack_160;
  StructDataBitCount local_158;
  StructPointerCount SStack_154;
  undefined2 uStack_152;
  undefined8 local_150;
  SegmentBuilder *pSStack_148;
  CapTableBuilder *pCStack_140;
  undefined2 *puStack_138;
  WirePointer *pWStack_130;
  StructDataBitCount local_128;
  StructPointerCount SStack_124;
  undefined2 uStack_122;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_628,&local_120.super_MessageBuilder);
  PointerBuilder::initStruct
            (&local_578,(PointerBuilder *)&stack0xfffffffffffffa48,(StructSize)0x20000);
  pWVar22 = local_578.pointers + 1;
  pSVar18 = local_578.segment;
  pCVar20 = local_578.capTable;
  PointerBuilder::initStructList
            ((ListBuilder *)local_528,(PointerBuilder *)&stack0xfffffffffffffa48,3,
             (StructSize)0x10001);
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa48,(ListBuilder *)local_528,0);
  (pWVar22->offsetAndKind).value = 0x7b;
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa48,(ListBuilder *)local_528,0);
  value_22.super_StringPtr.content.size_ = 4;
  value_22.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_628,value_22);
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa48,(ListBuilder *)local_528,1);
  (pWVar22->offsetAndKind).value = 0x1c8;
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa48,(ListBuilder *)local_528,1);
  value_23.super_StringPtr.content.size_ = 4;
  value_23.super_StringPtr.content.ptr = "bar";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_628,value_23);
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa48,(ListBuilder *)local_528,2);
  (pWVar22->offsetAndKind).value = 0x315;
  local_628.text.content.ptr = (char *)pCVar20;
  local_628.text.content.size_ = (size_t)in_stack_fffffffffffffa60;
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa48,(ListBuilder *)local_528,2);
  value_24.super_StringPtr.content.size_ = 4;
  value_24.super_StringPtr.content.ptr = "baz";
  pCVar16 = (CapTableBuilder *)local_628.text.content.ptr;
  pWVar17 = (WirePointer *)local_628.text.content.size_;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_628,value_24);
  local_548.content.ptr =
       "( structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
  ;
  pSStack_148 = local_578.segment;
  pCStack_140 = local_578.capTable;
  puStack_138 = (undefined2 *)local_578.data;
  pWStack_130 = local_578.pointers;
  local_128 = local_578.dataSize;
  SStack_124 = local_578.pointerCount;
  uStack_122 = local_578._38_2_;
  local_150 = 0x6c1088;
  uVar6 = 0x6c1088;
  value.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa28;
  value.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa20;
  value.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa30;
  value.builder.data = (void *)in_stack_fffffffffffffa38;
  value.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
  value.builder._32_8_ = pSVar18;
  pSVar9 = local_578.segment;
  pCVar20 = local_578.capTable;
  puVar12 = (undefined2 *)local_578.data;
  pWVar21 = local_578.pointers;
  uVar14 = local_578._32_8_;
  prettyPrint(value);
  kj::StringTree::flatten((String *)&local_5e8,&local_628);
  kj::_::DebugExpression<char_const(&)[149]>::operator==
            ((DebugComparison<const_char_(&)[149],_kj::String> *)&stack0xfffffffffffffa48,
             (DebugExpression<char_const(&)[149]> *)&local_548,(String *)&local_5e8);
  pSVar11 = local_5e8;
  pCVar15 = in_stack_fffffffffffffa20;
  if (local_5e8 != (SegmentBuilder *)0x0) {
    local_5e8 = (SegmentBuilder *)0x0;
    pCVar15 = (CapTableBuilder *)0x0;
    (**in_stack_fffffffffffffa28->_vptr_ArrayDisposer)
              (in_stack_fffffffffffffa28,pSVar11,1,in_stack_fffffffffffffa20,
               in_stack_fffffffffffffa20,0,uVar6,pSVar9,pCVar20,puVar12,pWVar21,uVar14);
  }
  sVar1 = local_628.branches.size_;
  pBVar2 = local_628.branches.ptr;
  if (local_628.branches.ptr != (Branch *)0x0) {
    local_628.branches.ptr = (Branch *)0x0;
    local_628.branches.size_ = 0;
    (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
              (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar1 = local_628.text.content.size_;
  pcVar7 = local_628.text.content.ptr;
  if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
    local_628.text.content.ptr = (char *)0x0;
    local_628.text.content.size_ = 0;
    (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
              (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
  }
  if ((local_588 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_178 = local_578.segment;
    pCStack_170 = local_578.capTable;
    puStack_168 = (undefined2 *)local_578.data;
    pWStack_160 = local_578.pointers;
    local_158 = local_578.dataSize;
    SStack_154 = local_578.pointerCount;
    uStack_152 = local_578._38_2_;
    local_180 = 0x6c1088;
    value_00.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa28;
    value_00.schema.super_Schema.raw = (Schema)(Schema)pCVar15;
    value_00.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa30;
    value_00.builder.data = (void *)in_stack_fffffffffffffa38;
    value_00.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
    value_00.builder._32_8_ = pSVar18;
    pCVar20 = local_578.capTable;
    puVar12 = (undefined2 *)local_578.data;
    pWVar21 = local_578.pointers;
    uVar14 = local_578._32_8_;
    prettyPrint(value_00);
    pSVar10 = (String *)&local_5e8;
    kj::StringTree::flatten(pSVar10,&local_628);
    pcVar7 = 
    "( structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
    ;
    kj::_::Debug::
    log<char_const(&)[221],kj::_::DebugComparison<char_const(&)[149],kj::String>&,char_const(&)[149],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x1ea,ERROR,
               "\"failed: expected \" \"(\\\"( structList = [\\\\n\\\" \\\"    (int32Field = 123, textField = \\\\\\\"foo\\\\\\\"),\\\\n\\\" \\\"    (int32Field = 456, textField = \\\\\\\"bar\\\\\\\"),\\\\n\\\" \\\"    (int32Field = 789, textField = \\\\\\\"baz\\\\\\\") ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( structList = [\\n\" \"    (int32Field = 123, textField = \\\"foo\\\"),\\n\" \"    (int32Field = 456, textField = \\\"bar\\\"),\\n\" \"    (int32Field = 789, textField = \\\"baz\\\") ] )\", prettyPrint(root).flatten()"
               ,(char (*) [221])
                "failed: expected (\"( structList = [\\n\" \"    (int32Field = 123, textField = \\\"foo\\\"),\\n\" \"    (int32Field = 456, textField = \\\"bar\\\"),\\n\" \"    (int32Field = 789, textField = \\\"baz\\\") ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[149],_kj::String> *)&stack0xfffffffffffffa48,
               (char (*) [149])
               "( structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
               ,pSVar10);
    pSVar11 = local_5e8;
    if (local_5e8 != (SegmentBuilder *)0x0) {
      local_5e8 = (SegmentBuilder *)0x0;
      pCVar19 = (CapTableBuilder *)0x0;
      (**in_stack_fffffffffffffa28->_vptr_ArrayDisposer)
                (in_stack_fffffffffffffa28,pSVar11,1,pCVar15,pCVar15,0,pcVar7,pSVar10,pCVar20,
                 puVar12,pWVar21,uVar14);
      pCVar15 = pCVar19;
    }
    sVar1 = local_628.branches.size_;
    pBVar2 = local_628.branches.ptr;
    if (local_628.branches.ptr != (Branch *)0x0) {
      local_628.branches.ptr = (Branch *)0x0;
      local_628.branches.size_ = 0;
      (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
                (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar1 = local_628.text.content.size_;
    pcVar7 = local_628.text.content.ptr;
    if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
      local_628.text.content.ptr = (char *)0x0;
      local_628.text.content.size_ = 0;
      (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
                (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
    }
  }
  if (pCVar16 != (CapTableBuilder *)0x0) {
    (**(code **)*pWVar17)(pWVar17,pCVar16,1,pWVar22,pWVar22,0);
  }
  value_25.super_StringPtr.content.size_ = 4;
  value_25.super_StringPtr.content.ptr = "foo";
  pSVar18 = local_578.segment;
  pCVar19 = local_578.capTable;
  pWVar22 = local_578.pointers;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&stack0xfffffffffffffa48,value_25);
  local_548.content.ptr =
       "( someText = \"foo\",\n  structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
  ;
  pSStack_1a8 = local_578.segment;
  pCStack_1a0 = local_578.capTable;
  puStack_198 = (undefined2 *)local_578.data;
  pWStack_190 = local_578.pointers;
  local_188 = local_578.dataSize;
  SStack_184 = local_578.pointerCount;
  uStack_182 = local_578._38_2_;
  local_1b0 = 0x6c1088;
  uVar6 = 0x6c1088;
  value_01.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa28;
  value_01.schema.super_Schema.raw = (Schema)(Schema)pCVar15;
  value_01.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa30;
  value_01.builder.data = (void *)in_stack_fffffffffffffa38;
  value_01.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
  value_01.builder._32_8_ = pSVar18;
  pSVar9 = local_578.segment;
  pCVar20 = local_578.capTable;
  puVar12 = (undefined2 *)local_578.data;
  pWVar21 = local_578.pointers;
  uVar14 = local_578._32_8_;
  prettyPrint(value_01);
  kj::StringTree::flatten((String *)&local_5e8,&local_628);
  kj::_::DebugExpression<char_const(&)[169]>::operator==
            ((DebugComparison<const_char_(&)[169],_kj::String> *)&stack0xfffffffffffffa48,
             (DebugExpression<char_const(&)[169]> *)&local_548,(String *)&local_5e8);
  pSVar11 = local_5e8;
  pCVar16 = pCVar15;
  if (local_5e8 != (SegmentBuilder *)0x0) {
    local_5e8 = (SegmentBuilder *)0x0;
    pCVar16 = (CapTableBuilder *)0x0;
    (**in_stack_fffffffffffffa28->_vptr_ArrayDisposer)
              (in_stack_fffffffffffffa28,pSVar11,1,pCVar15,pCVar15,0,uVar6,pSVar9,pCVar20,puVar12,
               pWVar21,uVar14);
  }
  sVar1 = local_628.branches.size_;
  pBVar2 = local_628.branches.ptr;
  if (local_628.branches.ptr != (Branch *)0x0) {
    local_628.branches.ptr = (Branch *)0x0;
    local_628.branches.size_ = 0;
    (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
              (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar1 = local_628.text.content.size_;
  pcVar7 = local_628.text.content.ptr;
  if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
    local_628.text.content.ptr = (char *)0x0;
    local_628.text.content.size_ = 0;
    (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
              (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
  }
  if ((local_588 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_1d8 = local_578.segment;
    pCStack_1d0 = local_578.capTable;
    puStack_1c8 = (undefined2 *)local_578.data;
    pWStack_1c0 = local_578.pointers;
    local_1b8 = local_578.dataSize;
    SStack_1b4 = local_578.pointerCount;
    uStack_1b2 = local_578._38_2_;
    local_1e0 = 0x6c1088;
    value_02.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa28;
    value_02.schema.super_Schema.raw = (Schema)(Schema)pCVar16;
    value_02.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa30;
    value_02.builder.data = (void *)in_stack_fffffffffffffa38;
    value_02.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
    value_02.builder._32_8_ = pSVar18;
    pCVar20 = local_578.capTable;
    puVar12 = (undefined2 *)local_578.data;
    pWVar21 = local_578.pointers;
    uVar14 = local_578._32_8_;
    prettyPrint(value_02);
    pSVar10 = (String *)&local_5e8;
    kj::StringTree::flatten(pSVar10,&local_628);
    pcVar7 = 
    "( someText = \"foo\",\n  structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
    ;
    kj::_::Debug::
    log<char_const(&)[247],kj::_::DebugComparison<char_const(&)[169],kj::String>&,char_const(&)[169],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,500,ERROR,
               "\"failed: expected \" \"(\\\"( someText = \\\\\\\"foo\\\\\\\",\\\\n\\\" \\\"  structList = [\\\\n\\\" \\\"    (int32Field = 123, textField = \\\\\\\"foo\\\\\\\"),\\\\n\\\" \\\"    (int32Field = 456, textField = \\\\\\\"bar\\\\\\\"),\\\\n\\\" \\\"    (int32Field = 789, textField = \\\\\\\"baz\\\\\\\") ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( someText = \\\"foo\\\",\\n\" \"  structList = [\\n\" \"    (int32Field = 123, textField = \\\"foo\\\"),\\n\" \"    (int32Field = 456, textField = \\\"bar\\\"),\\n\" \"    (int32Field = 789, textField = \\\"baz\\\") ] )\", prettyPrint(root).flatten()"
               ,(char (*) [247])
                "failed: expected (\"( someText = \\\"foo\\\",\\n\" \"  structList = [\\n\" \"    (int32Field = 123, textField = \\\"foo\\\"),\\n\" \"    (int32Field = 456, textField = \\\"bar\\\"),\\n\" \"    (int32Field = 789, textField = \\\"baz\\\") ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[169],_kj::String> *)&stack0xfffffffffffffa48,
               (char (*) [169])
               "( someText = \"foo\",\n  structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
               ,pSVar10);
    pSVar11 = local_5e8;
    if (local_5e8 != (SegmentBuilder *)0x0) {
      local_5e8 = (SegmentBuilder *)0x0;
      pCVar15 = (CapTableBuilder *)0x0;
      (**in_stack_fffffffffffffa28->_vptr_ArrayDisposer)
                (in_stack_fffffffffffffa28,pSVar11,1,pCVar16,pCVar16,0,pcVar7,pSVar10,pCVar20,
                 puVar12,pWVar21,uVar14);
      pCVar16 = pCVar15;
    }
    sVar1 = local_628.branches.size_;
    pBVar2 = local_628.branches.ptr;
    if (local_628.branches.ptr != (Branch *)0x0) {
      local_628.branches.ptr = (Branch *)0x0;
      local_628.branches.size_ = 0;
      (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
                (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar1 = local_628.text.content.size_;
    pcVar7 = local_628.text.content.ptr;
    if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
      local_628.text.content.ptr = (char *)0x0;
      local_628.text.content.size_ = 0;
      (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
                (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
    }
  }
  if (pCVar19 != (CapTableBuilder *)0x0) {
    (**(code **)*pWVar17)(pWVar17,pCVar19,1,pWVar22,pWVar22,0);
  }
  MessageBuilder::getRootInternal((Builder *)&local_628,&local_120.super_MessageBuilder);
  PointerBuilder::initStruct
            (&local_578,(PointerBuilder *)&stack0xfffffffffffffa48,(StructSize)0xa0000);
  pWVar22 = local_578.pointers + 7;
  PointerBuilder::initList
            ((ListBuilder *)local_528,(PointerBuilder *)&stack0xfffffffffffffa48,POINTER,3);
  value_19._M_len = 4;
  value_19._M_array = (iterator)&stack0xfffffffffffffa48;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_528,0,value_19);
  value_20._M_len = 4;
  value_20._M_array = (iterator)&stack0xfffffffffffffa48;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_528,1,value_20);
  pSVar18 = (SegmentBuilder *)0x2a600000159;
  pCVar19 = (CapTableBuilder *)0x499602d200000390;
  value_21._M_len = 4;
  value_21._M_array = (iterator)&stack0xfffffffffffffa48;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_528,2,value_21);
  local_548.content.ptr =
       "[ [123, 456, 789, 1234567890],\n  [234, 567, 891, 1234567890],\n  [345, 678, 912, 1234567890] ]"
  ;
  LVar5 = ListSchema::of(INT32);
  aVar4 = LVar5.elementType.field_4;
  uVar3 = LVar5.elementType._0_8_ & 0xffffffffff00ffff |
          (ulong)(LVar5.elementType._0_4_ + 0x10000U & 0xff0000);
  local_488 = local_528._32_4_;
  SStack_484 = local_528._36_2_;
  EStack_482 = local_528[0x26];
  uStack_481 = local_528[0x27];
  local_498 = (byte *)local_528._16_8_;
  pWStack_490 = (WirePointer *)local_528._24_8_;
  local_4a8 = (SegmentBuilder *)local_528._0_8_;
  pCStack_4a0 = (CapTableBuilder *)local_528._8_8_;
  value_17.schema.elementType.field_4 =
       (anon_union_8_2_eba6ea51_for_Type_5)in_stack_fffffffffffffa38;
  value_17.schema.elementType._0_8_ = in_stack_fffffffffffffa30;
  value_17.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa40;
  value_17.builder.capTable = (CapTableBuilder *)pSVar18;
  value_17.builder.ptr = (byte *)pCVar19;
  value_17.builder._24_8_ = pWVar22;
  value_17.builder._32_8_ = pWVar17;
  pSVar9 = (SegmentBuilder *)local_528._0_8_;
  pCVar20 = (CapTableBuilder *)local_528._8_8_;
  pbVar13 = (byte *)local_528._16_8_;
  pWVar21 = (WirePointer *)local_528._24_8_;
  uVar14 = local_528._32_8_;
  local_4b8 = uVar3;
  aStack_4b0.scopeId = aVar4.scopeId;
  prettyPrint(value_17);
  kj::StringTree::flatten((String *)&local_5e8,&local_628);
  kj::_::DebugExpression<char_const(&)[94]>::operator==
            ((DebugComparison<const_char_(&)[94],_kj::String> *)&stack0xfffffffffffffa48,
             (DebugExpression<char_const(&)[94]> *)&local_548,(String *)&local_5e8);
  pSVar11 = local_5e8;
  pCVar15 = pCVar16;
  if (local_5e8 != (SegmentBuilder *)0x0) {
    local_5e8 = (SegmentBuilder *)0x0;
    pCVar15 = (CapTableBuilder *)0x0;
    (**in_stack_fffffffffffffa28->_vptr_ArrayDisposer)
              (in_stack_fffffffffffffa28,pSVar11,1,pCVar16,pCVar16,0,uVar3,aVar4.schema,pSVar9,
               pCVar20,pbVar13,pWVar21,uVar14);
  }
  sVar1 = local_628.branches.size_;
  pBVar2 = local_628.branches.ptr;
  if (local_628.branches.ptr != (Branch *)0x0) {
    local_628.branches.ptr = (Branch *)0x0;
    local_628.branches.size_ = 0;
    (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
              (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar1 = local_628.text.content.size_;
  pcVar7 = local_628.text.content.ptr;
  if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
    local_628.text.content.ptr = (char *)0x0;
    local_628.text.content.size_ = 0;
    (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
              (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
  }
  if ((local_588 == false) && (kj::_::Debug::minSeverity < 3)) {
    LVar5 = ListSchema::of(INT32);
    aStack_4e8 = LVar5.elementType.field_4;
    local_4f0 = LVar5.elementType._0_8_ & 0xffffffffff00ffff |
                (ulong)(LVar5.elementType._0_4_ + 0x10000U & 0xff0000);
    local_4c0 = local_528._32_4_;
    SStack_4bc = local_528._36_2_;
    EStack_4ba = local_528[0x26];
    uStack_4b9 = local_528[0x27];
    local_4d0 = (byte *)local_528._16_8_;
    pWStack_4c8 = (WirePointer *)local_528._24_8_;
    local_4e0 = (SegmentBuilder *)local_528._0_8_;
    pCStack_4d8 = (CapTableBuilder *)local_528._8_8_;
    value_18.schema.elementType.field_4.schema = (RawBrandedSchema *)in_stack_fffffffffffffa38;
    value_18.schema.elementType._0_8_ = in_stack_fffffffffffffa30;
    value_18.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa40;
    value_18.builder.capTable = (CapTableBuilder *)pSVar18;
    value_18.builder.ptr = (byte *)pCVar19;
    value_18.builder._24_8_ = pWVar22;
    value_18.builder._32_8_ = pWVar17;
    pSVar9 = (SegmentBuilder *)local_528._0_8_;
    pCVar20 = (CapTableBuilder *)local_528._8_8_;
    pWVar21 = (WirePointer *)local_528._24_8_;
    prettyPrint(value_18);
    pSVar10 = (String *)&local_5e8;
    kj::StringTree::flatten(pSVar10,&local_628);
    pcVar7 = 
    "[ [123, 456, 789, 1234567890],\n  [234, 567, 891, 1234567890],\n  [345, 678, 912, 1234567890] ]"
    ;
    kj::_::Debug::
    log<char_const(&)[154],kj::_::DebugComparison<char_const(&)[94],kj::String>&,char_const(&)[94],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x202,ERROR,
               "\"failed: expected \" \"(\\\"[ [123, 456, 789, 1234567890],\\\\n\\\" \\\"  [234, 567, 891, 1234567890],\\\\n\\\" \\\"  [345, 678, 912, 1234567890] ]\\\") == (prettyPrint(ll).flatten())\", _kjCondition, \"[ [123, 456, 789, 1234567890],\\n\" \"  [234, 567, 891, 1234567890],\\n\" \"  [345, 678, 912, 1234567890] ]\", prettyPrint(ll).flatten()"
               ,(char (*) [154])
                "failed: expected (\"[ [123, 456, 789, 1234567890],\\n\" \"  [234, 567, 891, 1234567890],\\n\" \"  [345, 678, 912, 1234567890] ]\") == (prettyPrint(ll).flatten())"
               ,(DebugComparison<const_char_(&)[94],_kj::String> *)&stack0xfffffffffffffa48,
               (char (*) [94])
               "[ [123, 456, 789, 1234567890],\n  [234, 567, 891, 1234567890],\n  [345, 678, 912, 1234567890] ]"
               ,pSVar10);
    pSVar11 = local_5e8;
    if (local_5e8 != (SegmentBuilder *)0x0) {
      local_5e8 = (SegmentBuilder *)0x0;
      pCVar16 = (CapTableBuilder *)0x0;
      (**in_stack_fffffffffffffa28->_vptr_ArrayDisposer)
                (in_stack_fffffffffffffa28,pSVar11,1,pCVar15,pCVar15,0,pcVar7,pSVar10,pSVar9,pCVar20
                 ,local_528._16_8_,pWVar21,local_528._32_8_);
      pCVar15 = pCVar16;
    }
    sVar1 = local_628.branches.size_;
    pBVar2 = local_628.branches.ptr;
    if (local_628.branches.ptr != (Branch *)0x0) {
      local_628.branches.ptr = (Branch *)0x0;
      local_628.branches.size_ = 0;
      (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
                (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar1 = local_628.text.content.size_;
    pcVar7 = local_628.text.content.ptr;
    if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
      local_628.text.content.ptr = (char *)0x0;
      local_628.text.content.size_ = 0;
      (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
                (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
    }
  }
  pCVar20 = pCVar19;
  pWVar21 = pWVar22;
  if (pCVar19 != (CapTableBuilder *)0x0) {
    pCVar20 = (CapTableBuilder *)0x0;
    pWVar21 = (WirePointer *)0x0;
    (**(code **)*pWVar17)(pWVar17,pCVar19,1,pWVar22,pWVar22,0);
  }
  local_548.content.ptr =
       "( int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
  ;
  pSStack_208 = local_578.segment;
  pCStack_200 = local_578.capTable;
  puStack_1f8 = (undefined2 *)local_578.data;
  pWStack_1f0 = local_578.pointers;
  local_1e8 = local_578.dataSize;
  SStack_1e4 = local_578.pointerCount;
  uStack_1e2 = local_578._38_2_;
  local_210 = 0x6c0208;
  uVar6 = 0x6c0208;
  value_03.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa28;
  value_03.schema.super_Schema.raw = (Schema)(Schema)pCVar15;
  value_03.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa30;
  value_03.builder.data = (void *)in_stack_fffffffffffffa38;
  value_03.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
  value_03.builder._32_8_ = pSVar18;
  pSVar9 = local_578.segment;
  pCVar16 = local_578.capTable;
  puVar12 = (undefined2 *)local_578.data;
  pWVar22 = local_578.pointers;
  uVar14 = local_578._32_8_;
  prettyPrint(value_03);
  kj::StringTree::flatten((String *)&local_5e8,&local_628);
  kj::_::DebugExpression<char_const(&)[122]>::operator==
            ((DebugComparison<const_char_(&)[122],_kj::String> *)&stack0xfffffffffffffa48,
             (DebugExpression<char_const(&)[122]> *)&local_548,(String *)&local_5e8);
  pSVar11 = local_5e8;
  pCVar19 = pCVar15;
  if (local_5e8 != (SegmentBuilder *)0x0) {
    local_5e8 = (SegmentBuilder *)0x0;
    pCVar19 = (CapTableBuilder *)0x0;
    (**in_stack_fffffffffffffa28->_vptr_ArrayDisposer)
              (in_stack_fffffffffffffa28,pSVar11,1,pCVar15,pCVar15,0,uVar6,pSVar9,pCVar16,puVar12,
               pWVar22,uVar14);
  }
  sVar1 = local_628.branches.size_;
  pBVar2 = local_628.branches.ptr;
  if (local_628.branches.ptr != (Branch *)0x0) {
    local_628.branches.ptr = (Branch *)0x0;
    local_628.branches.size_ = 0;
    (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
              (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar1 = local_628.text.content.size_;
  pcVar7 = local_628.text.content.ptr;
  if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
    local_628.text.content.ptr = (char *)0x0;
    local_628.text.content.size_ = 0;
    (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
              (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
  }
  if ((local_588 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_238 = local_578.segment;
    pCStack_230 = local_578.capTable;
    puStack_228 = (undefined2 *)local_578.data;
    pWStack_220 = local_578.pointers;
    local_218 = local_578.dataSize;
    SStack_214 = local_578.pointerCount;
    uStack_212 = local_578._38_2_;
    local_240 = 0x6c0208;
    value_04.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa28;
    value_04.schema.super_Schema.raw = (Schema)(Schema)pCVar19;
    value_04.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa30;
    value_04.builder.data = (void *)in_stack_fffffffffffffa38;
    value_04.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
    value_04.builder._32_8_ = pSVar18;
    pCVar15 = local_578.capTable;
    puVar12 = (undefined2 *)local_578.data;
    pWVar22 = local_578.pointers;
    uVar14 = local_578._32_8_;
    prettyPrint(value_04);
    pSVar10 = (String *)&local_5e8;
    kj::StringTree::flatten(pSVar10,&local_628);
    pcVar7 = 
    "( int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
    ;
    kj::_::Debug::
    log<char_const(&)[188],kj::_::DebugComparison<char_const(&)[122],kj::String>&,char_const(&)[122],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x209,ERROR,
               "\"failed: expected \" \"(\\\"( int32ListList = [\\\\n\\\" \\\"    [123, 456, 789, 1234567890],\\\\n\\\" \\\"    [234, 567, 891, 1234567890],\\\\n\\\" \\\"    [345, 678, 912, 1234567890] ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\", prettyPrint(root).flatten()"
               ,(char (*) [188])
                "failed: expected (\"( int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[122],_kj::String> *)&stack0xfffffffffffffa48,
               (char (*) [122])
               "( int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
               ,pSVar10);
    pSVar11 = local_5e8;
    if (local_5e8 != (SegmentBuilder *)0x0) {
      local_5e8 = (SegmentBuilder *)0x0;
      pCVar16 = (CapTableBuilder *)0x0;
      (**in_stack_fffffffffffffa28->_vptr_ArrayDisposer)
                (in_stack_fffffffffffffa28,pSVar11,1,pCVar19,pCVar19,0,pcVar7,pSVar10,pCVar15,
                 puVar12,pWVar22,uVar14);
      pCVar19 = pCVar16;
    }
    sVar1 = local_628.branches.size_;
    pBVar2 = local_628.branches.ptr;
    if (local_628.branches.ptr != (Branch *)0x0) {
      local_628.branches.ptr = (Branch *)0x0;
      local_628.branches.size_ = 0;
      (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
                (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar1 = local_628.text.content.size_;
    pcVar7 = local_628.text.content.ptr;
    if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
      local_628.text.content.ptr = (char *)0x0;
      local_628.text.content.size_ = 0;
      (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
                (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
    }
  }
  pCVar15 = pCVar20;
  pWVar22 = pWVar21;
  if (pCVar20 != (CapTableBuilder *)0x0) {
    pCVar15 = (CapTableBuilder *)0x0;
    pWVar22 = (WirePointer *)0x0;
    (**(code **)*pWVar17)(pWVar17,pCVar20,1,pWVar21,pWVar21,0);
  }
  local_628.text.content.size_ = (size_t)(local_578.pointers + 2);
  local_628.size_ = (size_t)local_578.segment;
  local_628.text.content.ptr = (char *)local_578.capTable;
  PointerBuilder::initStructList
            ((ListBuilder *)&stack0xfffffffffffffa48,(PointerBuilder *)&local_628,0,(StructSize)0x1)
  ;
  local_548.content.ptr =
       "( list8 = [],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
  ;
  pSStack_268 = local_578.segment;
  pCStack_260 = local_578.capTable;
  puStack_258 = (undefined2 *)local_578.data;
  pWStack_250 = local_578.pointers;
  local_248 = local_578.dataSize;
  SStack_244 = local_578.pointerCount;
  uStack_242 = local_578._38_2_;
  local_270 = 0x6c0208;
  uVar6 = 0x6c0208;
  value_05.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa28;
  value_05.schema.super_Schema.raw = (Schema)(Schema)pCVar19;
  value_05.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa30;
  value_05.builder.data = (void *)in_stack_fffffffffffffa38;
  value_05.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
  value_05.builder._32_8_ = pSVar18;
  pSVar9 = local_578.segment;
  pCVar20 = local_578.capTable;
  puVar12 = (undefined2 *)local_578.data;
  pWVar21 = local_578.pointers;
  uVar14 = local_578._32_8_;
  prettyPrint(value_05);
  kj::StringTree::flatten((String *)&local_5e8,&local_628);
  kj::_::DebugExpression<char_const(&)[136]>::operator==
            ((DebugComparison<const_char_(&)[136],_kj::String> *)&stack0xfffffffffffffa48,
             (DebugExpression<char_const(&)[136]> *)&local_548,(String *)&local_5e8);
  pSVar11 = local_5e8;
  pCVar16 = pCVar19;
  if (local_5e8 != (SegmentBuilder *)0x0) {
    local_5e8 = (SegmentBuilder *)0x0;
    pCVar16 = (CapTableBuilder *)0x0;
    (**in_stack_fffffffffffffa28->_vptr_ArrayDisposer)
              (in_stack_fffffffffffffa28,pSVar11,1,pCVar19,pCVar19,0,uVar6,pSVar9,pCVar20,puVar12,
               pWVar21,uVar14);
  }
  sVar1 = local_628.branches.size_;
  pBVar2 = local_628.branches.ptr;
  if (local_628.branches.ptr != (Branch *)0x0) {
    local_628.branches.ptr = (Branch *)0x0;
    local_628.branches.size_ = 0;
    (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
              (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar1 = local_628.text.content.size_;
  pcVar7 = local_628.text.content.ptr;
  if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
    local_628.text.content.ptr = (char *)0x0;
    local_628.text.content.size_ = 0;
    (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
              (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
  }
  if ((local_588 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_298 = local_578.segment;
    pCStack_290 = local_578.capTable;
    puStack_288 = (undefined2 *)local_578.data;
    pWStack_280 = local_578.pointers;
    local_278 = local_578.dataSize;
    SStack_274 = local_578.pointerCount;
    uStack_272 = local_578._38_2_;
    local_2a0 = 0x6c0208;
    value_06.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa28;
    value_06.schema.super_Schema.raw = (Schema)(Schema)pCVar16;
    value_06.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa30;
    value_06.builder.data = (void *)in_stack_fffffffffffffa38;
    value_06.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
    value_06.builder._32_8_ = pSVar18;
    pCVar20 = local_578.capTable;
    puVar12 = (undefined2 *)local_578.data;
    pWVar21 = local_578.pointers;
    uVar14 = local_578._32_8_;
    prettyPrint(value_06);
    pSVar10 = (String *)&local_5e8;
    kj::StringTree::flatten(pSVar10,&local_628);
    pcVar7 = 
    "( list8 = [],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
    ;
    kj::_::Debug::
    log<char_const(&)[206],kj::_::DebugComparison<char_const(&)[136],kj::String>&,char_const(&)[136],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x213,ERROR,
               "\"failed: expected \" \"(\\\"( list8 = [],\\\\n\\\" \\\"  int32ListList = [\\\\n\\\" \\\"    [123, 456, 789, 1234567890],\\\\n\\\" \\\"    [234, 567, 891, 1234567890],\\\\n\\\" \\\"    [345, 678, 912, 1234567890] ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( list8 = [],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\", prettyPrint(root).flatten()"
               ,(char (*) [206])
                "failed: expected (\"( list8 = [],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[136],_kj::String> *)&stack0xfffffffffffffa48,
               (char (*) [136])
               "( list8 = [],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
               ,pSVar10);
    pSVar11 = local_5e8;
    if (local_5e8 != (SegmentBuilder *)0x0) {
      local_5e8 = (SegmentBuilder *)0x0;
      pCVar19 = (CapTableBuilder *)0x0;
      (**in_stack_fffffffffffffa28->_vptr_ArrayDisposer)
                (in_stack_fffffffffffffa28,pSVar11,1,pCVar16,pCVar16,0,pcVar7,pSVar10,pCVar20,
                 puVar12,pWVar21,uVar14);
      pCVar16 = pCVar19;
    }
    sVar1 = local_628.branches.size_;
    pBVar2 = local_628.branches.ptr;
    if (local_628.branches.ptr != (Branch *)0x0) {
      local_628.branches.ptr = (Branch *)0x0;
      local_628.branches.size_ = 0;
      (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
                (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar1 = local_628.text.content.size_;
    pcVar7 = local_628.text.content.ptr;
    if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
      local_628.text.content.ptr = (char *)0x0;
      local_628.text.content.size_ = 0;
      (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
                (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
    }
  }
  if (pCVar15 != (CapTableBuilder *)0x0) {
    (**(code **)*pWVar17)(pWVar17,pCVar15,1,pWVar22,pWVar22,0);
  }
  pWVar22 = local_578.pointers + 2;
  pSVar9 = local_578.segment;
  pCVar15 = local_578.capTable;
  PointerBuilder::initStructList
            ((ListBuilder *)&local_5e8,(PointerBuilder *)&stack0xfffffffffffffa48,1,(StructSize)0x1)
  ;
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa48,(ListBuilder *)&local_5e8,0);
  *(undefined1 *)&(pWVar22->offsetAndKind).value = 0xc;
  local_4f8 = 
  "( list8 = [(f = 12)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
  ;
  pSStack_2c8 = local_578.segment;
  pCStack_2c0 = local_578.capTable;
  puStack_2b8 = (undefined2 *)local_578.data;
  pWStack_2b0 = local_578.pointers;
  local_2a8 = local_578.dataSize;
  SStack_2a4 = local_578.pointerCount;
  uStack_2a2 = local_578._38_2_;
  local_2d0 = 0x6c0208;
  uVar6 = 0x6c0208;
  value_07.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa28;
  value_07.schema.super_Schema.raw = (Schema)(Schema)pCVar16;
  value_07.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa30;
  value_07.builder.data = (void *)in_stack_fffffffffffffa38;
  value_07.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
  value_07.builder._32_8_ = pSVar9;
  pSVar11 = local_578.segment;
  pCVar20 = local_578.capTable;
  puVar12 = (undefined2 *)local_578.data;
  pWVar21 = local_578.pointers;
  uVar14 = local_578._32_8_;
  prettyPrint(value_07);
  kj::StringTree::flatten(&local_548,&local_628);
  kj::_::DebugExpression<char_const(&)[144]>::operator==
            ((DebugComparison<const_char_(&)[144],_kj::String> *)&stack0xfffffffffffffa48,
             (DebugExpression<char_const(&)[144]> *)&local_4f8,&local_548);
  sVar1 = local_548.content.size_;
  pcVar7 = local_548.content.ptr;
  if (local_548.content.ptr != (char *)0x0) {
    local_548.content.ptr = (char *)0x0;
    local_548.content.size_ = 0;
    (**(local_548.content.disposer)->_vptr_ArrayDisposer)
              (local_548.content.disposer,pcVar7,1,sVar1,sVar1,0,uVar6,pSVar11,pCVar20,puVar12,
               pWVar21,uVar14);
  }
  sVar1 = local_628.branches.size_;
  pBVar2 = local_628.branches.ptr;
  if (local_628.branches.ptr != (Branch *)0x0) {
    local_628.branches.ptr = (Branch *)0x0;
    local_628.branches.size_ = 0;
    (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
              (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar1 = local_628.text.content.size_;
  pcVar7 = local_628.text.content.ptr;
  if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
    local_628.text.content.ptr = (char *)0x0;
    local_628.text.content.size_ = 0;
    (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
              (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
  }
  if ((local_588 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_2f8 = local_578.segment;
    pCStack_2f0 = local_578.capTable;
    puStack_2e8 = (undefined2 *)local_578.data;
    pWStack_2e0 = local_578.pointers;
    local_2d8 = local_578.dataSize;
    SStack_2d4 = local_578.pointerCount;
    uStack_2d2 = local_578._38_2_;
    local_300 = 0x6c0208;
    value_08.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa28;
    value_08.schema.super_Schema.raw = (Schema)(Schema)pCVar16;
    value_08.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa30;
    value_08.builder.data = (void *)in_stack_fffffffffffffa38;
    value_08.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
    value_08.builder._32_8_ = pSVar9;
    pCVar20 = local_578.capTable;
    puVar12 = (undefined2 *)local_578.data;
    pWVar21 = local_578.pointers;
    uVar14 = local_578._32_8_;
    prettyPrint(value_08);
    pSVar10 = &local_548;
    kj::StringTree::flatten(pSVar10,&local_628);
    pcVar8 = 
    "( list8 = [(f = 12)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
    ;
    kj::_::Debug::
    log<char_const(&)[214],kj::_::DebugComparison<char_const(&)[144],kj::String>&,char_const(&)[144],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x21e,ERROR,
               "\"failed: expected \" \"(\\\"( list8 = [(f = 12)],\\\\n\\\" \\\"  int32ListList = [\\\\n\\\" \\\"    [123, 456, 789, 1234567890],\\\\n\\\" \\\"    [234, 567, 891, 1234567890],\\\\n\\\" \\\"    [345, 678, 912, 1234567890] ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( list8 = [(f = 12)],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\", prettyPrint(root).flatten()"
               ,(char (*) [214])
                "failed: expected (\"( list8 = [(f = 12)],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[144],_kj::String> *)&stack0xfffffffffffffa48,
               (char (*) [144])
               "( list8 = [(f = 12)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
               ,pSVar10);
    sVar1 = local_548.content.size_;
    pcVar7 = local_548.content.ptr;
    if (local_548.content.ptr != (char *)0x0) {
      local_548.content.ptr = (char *)0x0;
      local_548.content.size_ = 0;
      (**(local_548.content.disposer)->_vptr_ArrayDisposer)
                (local_548.content.disposer,pcVar7,1,sVar1,sVar1,0,pcVar8,pSVar10,pCVar20,puVar12,
                 pWVar21,uVar14);
    }
    sVar1 = local_628.branches.size_;
    pBVar2 = local_628.branches.ptr;
    if (local_628.branches.ptr != (Branch *)0x0) {
      local_628.branches.ptr = (Branch *)0x0;
      local_628.branches.size_ = 0;
      (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
                (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar1 = local_628.text.content.size_;
    pcVar7 = local_628.text.content.ptr;
    if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
      local_628.text.content.ptr = (char *)0x0;
      local_628.text.content.size_ = 0;
      (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
                (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
    }
  }
  pCVar20 = pCVar15;
  pWVar21 = pWVar22;
  if (pCVar15 != (CapTableBuilder *)0x0) {
    pCVar20 = (CapTableBuilder *)0x0;
    pWVar21 = (WirePointer *)0x0;
    (**(code **)*pWVar17)(pWVar17,pCVar15,1,pWVar22,pWVar22,0);
  }
  local_628.text.content.size_ = (size_t)(local_578.pointers + 2);
  local_628.size_ = (size_t)local_578.segment;
  local_628.text.content.ptr = (char *)local_578.capTable;
  PointerBuilder::initStructList
            ((ListBuilder *)&stack0xfffffffffffffa48,(PointerBuilder *)&local_628,2,(StructSize)0x1)
  ;
  local_5e8 = pSVar9;
  pSVar9 = local_5e8;
  pCVar16 = pCVar20;
  pWVar23 = pWVar21;
  pWVar24 = pWVar17;
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa48,(ListBuilder *)&local_5e8,0);
  *(undefined1 *)&(pWVar23->offsetAndKind).value = 0xc;
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa48,(ListBuilder *)&local_5e8,1);
  *(undefined1 *)&(pWVar23->offsetAndKind).value = 0x22;
  local_4f8 = 
  "( list8 = [(f = 12), (f = 34)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
  ;
  pSStack_328 = local_578.segment;
  pCStack_320 = local_578.capTable;
  puStack_318 = (undefined2 *)local_578.data;
  pWStack_310 = local_578.pointers;
  local_308 = local_578.dataSize;
  SStack_304 = local_578.pointerCount;
  uStack_302 = local_578._38_2_;
  local_330 = 0x6c0208;
  uVar6 = 0x6c0208;
  value_09.builder.segment = (SegmentBuilder *)pWVar21;
  value_09.schema.super_Schema.raw = (Schema)(Schema)pCVar20;
  value_09.builder.capTable = (CapTableBuilder *)pWVar17;
  value_09.builder.data = local_598;
  value_09.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
  value_09.builder._32_8_ = pSVar9;
  pSVar11 = local_578.segment;
  pCVar15 = local_578.capTable;
  puVar12 = (undefined2 *)local_578.data;
  pWVar22 = local_578.pointers;
  uVar14 = local_578._32_8_;
  prettyPrint(value_09);
  kj::StringTree::flatten(&local_548,&local_628);
  kj::_::DebugExpression<char_const(&)[154]>::operator==
            ((DebugComparison<const_char_(&)[154],_kj::String> *)&stack0xfffffffffffffa48,
             (DebugExpression<char_const(&)[154]> *)&local_4f8,&local_548);
  sVar1 = local_548.content.size_;
  pcVar7 = local_548.content.ptr;
  if (local_548.content.ptr != (char *)0x0) {
    local_548.content.ptr = (char *)0x0;
    local_548.content.size_ = 0;
    (**(local_548.content.disposer)->_vptr_ArrayDisposer)
              (local_548.content.disposer,pcVar7,1,sVar1,sVar1,0,uVar6,pSVar11,pCVar15,puVar12,
               pWVar22,uVar14);
  }
  sVar1 = local_628.branches.size_;
  pBVar2 = local_628.branches.ptr;
  if (local_628.branches.ptr != (Branch *)0x0) {
    local_628.branches.ptr = (Branch *)0x0;
    local_628.branches.size_ = 0;
    (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
              (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar1 = local_628.text.content.size_;
  pcVar7 = local_628.text.content.ptr;
  if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
    local_628.text.content.ptr = (char *)0x0;
    local_628.text.content.size_ = 0;
    (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
              (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
  }
  if ((local_588 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_358 = local_578.segment;
    pCStack_350 = local_578.capTable;
    puStack_348 = (undefined2 *)local_578.data;
    pWStack_340 = local_578.pointers;
    local_338 = local_578.dataSize;
    SStack_334 = local_578.pointerCount;
    uStack_332 = local_578._38_2_;
    local_360 = 0x6c0208;
    value_10.builder.segment = (SegmentBuilder *)pWVar21;
    value_10.schema.super_Schema.raw = (Schema)(Schema)pCVar20;
    value_10.builder.capTable = (CapTableBuilder *)pWVar17;
    value_10.builder.data = local_598;
    value_10.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
    value_10.builder._32_8_ = pSVar9;
    pCVar15 = local_578.capTable;
    puVar12 = (undefined2 *)local_578.data;
    pWVar22 = local_578.pointers;
    uVar14 = local_578._32_8_;
    prettyPrint(value_10);
    pSVar10 = &local_548;
    kj::StringTree::flatten(pSVar10,&local_628);
    pcVar8 = 
    "( list8 = [(f = 12), (f = 34)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
    ;
    kj::_::Debug::
    log<char_const(&)[224],kj::_::DebugComparison<char_const(&)[154],kj::String>&,char_const(&)[154],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x22a,ERROR,
               "\"failed: expected \" \"(\\\"( list8 = [(f = 12), (f = 34)],\\\\n\\\" \\\"  int32ListList = [\\\\n\\\" \\\"    [123, 456, 789, 1234567890],\\\\n\\\" \\\"    [234, 567, 891, 1234567890],\\\\n\\\" \\\"    [345, 678, 912, 1234567890] ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( list8 = [(f = 12), (f = 34)],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\", prettyPrint(root).flatten()"
               ,(char (*) [224])
                "failed: expected (\"( list8 = [(f = 12), (f = 34)],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[154],_kj::String> *)&stack0xfffffffffffffa48,
               (char (*) [154])
               "( list8 = [(f = 12), (f = 34)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
               ,pSVar10);
    sVar1 = local_548.content.size_;
    pcVar7 = local_548.content.ptr;
    if (local_548.content.ptr != (char *)0x0) {
      local_548.content.ptr = (char *)0x0;
      local_548.content.size_ = 0;
      (**(local_548.content.disposer)->_vptr_ArrayDisposer)
                (local_548.content.disposer,pcVar7,1,sVar1,sVar1,0,pcVar8,pSVar10,pCVar15,puVar12,
                 pWVar22,uVar14);
    }
    sVar1 = local_628.branches.size_;
    pBVar2 = local_628.branches.ptr;
    if (local_628.branches.ptr != (Branch *)0x0) {
      local_628.branches.ptr = (Branch *)0x0;
      local_628.branches.size_ = 0;
      (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
                (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar1 = local_628.text.content.size_;
    pcVar7 = local_628.text.content.ptr;
    if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
      local_628.text.content.ptr = (char *)0x0;
      local_628.text.content.size_ = 0;
      (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
                (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
    }
  }
  if (pCVar16 != (CapTableBuilder *)0x0) {
    (**(code **)*pWVar24)(pWVar24,pCVar16,1,pWVar23,pWVar23,0);
  }
  MessageBuilder::getRootInternal((Builder *)&local_628,&local_120.super_MessageBuilder);
  PointerBuilder::initStruct
            (&local_578,(PointerBuilder *)&stack0xfffffffffffffa48,(StructSize)0x10001);
  *(undefined2 *)local_578.data = 0;
  pSVar18 = local_578.segment;
  pCVar19 = local_578.capTable;
  pWVar23 = local_578.pointers;
  PointerBuilder::initStruct
            ((StructBuilder *)local_528,(PointerBuilder *)&stack0xfffffffffffffa48,
             (StructSize)0x20000);
  local_548.content.ptr = "(un = (struct = ()))";
  pSStack_388 = local_578.segment;
  pCStack_380 = local_578.capTable;
  puStack_378 = (undefined2 *)local_578.data;
  pWStack_370 = local_578.pointers;
  local_368 = local_578.dataSize;
  SStack_364 = local_578.pointerCount;
  uStack_362 = local_578._38_2_;
  local_390 = 0x6c0ee0;
  uVar6 = 0x6c0ee0;
  value_11.builder.segment = (SegmentBuilder *)pWVar21;
  value_11.schema.super_Schema.raw = (Schema)(Schema)pCVar20;
  value_11.builder.capTable = (CapTableBuilder *)pWVar17;
  value_11.builder.data = local_598;
  value_11.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
  value_11.builder._32_8_ = pSVar18;
  pSVar9 = local_578.segment;
  pCVar15 = local_578.capTable;
  puVar12 = (undefined2 *)local_578.data;
  pWVar22 = local_578.pointers;
  uVar14 = local_578._32_8_;
  prettyPrint(value_11);
  kj::StringTree::flatten((String *)&local_5e8,&local_628);
  kj::_::DebugExpression<char_const(&)[21]>::operator==
            ((DebugComparison<const_char_(&)[21],_kj::String> *)&stack0xfffffffffffffa48,
             (DebugExpression<char_const(&)[21]> *)&local_548,(String *)&local_5e8);
  pSVar11 = local_5e8;
  pCVar16 = pCVar20;
  if (local_5e8 != (SegmentBuilder *)0x0) {
    local_5e8 = (SegmentBuilder *)0x0;
    pCVar16 = (CapTableBuilder *)0x0;
    (**(code **)*pWVar21)
              (pWVar21,pSVar11,1,pCVar20,pCVar20,0,uVar6,pSVar9,pCVar15,puVar12,pWVar22,uVar14);
  }
  sVar1 = local_628.branches.size_;
  pBVar2 = local_628.branches.ptr;
  if (local_628.branches.ptr != (Branch *)0x0) {
    local_628.branches.ptr = (Branch *)0x0;
    local_628.branches.size_ = 0;
    (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
              (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar1 = local_628.text.content.size_;
  pcVar7 = local_628.text.content.ptr;
  if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
    local_628.text.content.ptr = (char *)0x0;
    local_628.text.content.size_ = 0;
    (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
              (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
  }
  if ((local_588 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_3b8 = local_578.segment;
    pCStack_3b0 = local_578.capTable;
    puStack_3a8 = (undefined2 *)local_578.data;
    pWStack_3a0 = local_578.pointers;
    local_398 = local_578.dataSize;
    SStack_394 = local_578.pointerCount;
    uStack_392 = local_578._38_2_;
    local_3c0 = 0x6c0ee0;
    value_12.builder.segment = (SegmentBuilder *)pWVar21;
    value_12.schema.super_Schema.raw = (Schema)(Schema)pCVar16;
    value_12.builder.capTable = (CapTableBuilder *)pWVar17;
    value_12.builder.data = local_598;
    value_12.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
    value_12.builder._32_8_ = pSVar18;
    pCVar20 = local_578.capTable;
    puVar12 = (undefined2 *)local_578.data;
    pWVar22 = local_578.pointers;
    uVar14 = local_578._32_8_;
    prettyPrint(value_12);
    pSVar10 = (String *)&local_5e8;
    kj::StringTree::flatten(pSVar10,&local_628);
    pcVar7 = "(un = (struct = ()))";
    kj::_::Debug::
    log<char_const(&)[75],kj::_::DebugComparison<char_const(&)[21],kj::String>&,char_const(&)[21],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(\\\"(un = (struct = ()))\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"(un = (struct = ()))\", prettyPrint(root).flatten()"
               ,(char (*) [75])
                "failed: expected (\"(un = (struct = ()))\") == (prettyPrint(root).flatten())",
               (DebugComparison<const_char_(&)[21],_kj::String> *)&stack0xfffffffffffffa48,
               (char (*) [21])"(un = (struct = ()))",pSVar10);
    pSVar11 = local_5e8;
    if (local_5e8 != (SegmentBuilder *)0x0) {
      local_5e8 = (SegmentBuilder *)0x0;
      pCVar15 = (CapTableBuilder *)0x0;
      (**(code **)*pWVar21)
                (pWVar21,pSVar11,1,pCVar16,pCVar16,0,pcVar7,pSVar10,pCVar20,puVar12,pWVar22,uVar14);
      pCVar16 = pCVar15;
    }
    sVar1 = local_628.branches.size_;
    pBVar2 = local_628.branches.ptr;
    if (local_628.branches.ptr != (Branch *)0x0) {
      local_628.branches.ptr = (Branch *)0x0;
      local_628.branches.size_ = 0;
      (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
                (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar1 = local_628.text.content.size_;
    pcVar7 = local_628.text.content.ptr;
    if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
      local_628.text.content.ptr = (char *)0x0;
      local_628.text.content.size_ = 0;
      (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
                (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
    }
  }
  if (pCVar19 != (CapTableBuilder *)0x0) {
    (**(code **)*pWVar24)(pWVar24,pCVar19,1,pWVar23,pWVar23,0);
  }
  value_26.super_StringPtr.content.size_ = 4;
  value_26.super_StringPtr.content.ptr = "foo";
  pSVar18 = (SegmentBuilder *)local_528._0_8_;
  pCVar19 = (CapTableBuilder *)local_528._8_8_;
  pWVar23 = (WirePointer *)local_528._24_8_;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&stack0xfffffffffffffa48,value_26);
  local_548.content.ptr = "( un = (\n    struct = (someText = \"foo\") ) )";
  pSStack_3e8 = local_578.segment;
  pCStack_3e0 = local_578.capTable;
  puStack_3d8 = (undefined2 *)local_578.data;
  pWStack_3d0 = local_578.pointers;
  local_3c8 = local_578.dataSize;
  SStack_3c4 = local_578.pointerCount;
  uStack_3c2 = local_578._38_2_;
  local_3f0 = 0x6c0ee0;
  uVar6 = 0x6c0ee0;
  value_13.builder.segment = (SegmentBuilder *)pWVar21;
  value_13.schema.super_Schema.raw = (Schema)(Schema)pCVar16;
  value_13.builder.capTable = (CapTableBuilder *)pWVar17;
  value_13.builder.data = local_598;
  value_13.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
  value_13.builder._32_8_ = pSVar18;
  pSVar9 = local_578.segment;
  pCVar20 = local_578.capTable;
  puVar12 = (undefined2 *)local_578.data;
  pWVar22 = local_578.pointers;
  uVar14 = local_578._32_8_;
  prettyPrint(value_13);
  kj::StringTree::flatten((String *)&local_5e8,&local_628);
  kj::_::DebugExpression<char_const(&)[45]>::operator==
            ((DebugComparison<const_char_(&)[45],_kj::String> *)&stack0xfffffffffffffa48,
             (DebugExpression<char_const(&)[45]> *)&local_548,(String *)&local_5e8);
  pSVar11 = local_5e8;
  pCVar15 = pCVar16;
  if (local_5e8 != (SegmentBuilder *)0x0) {
    local_5e8 = (SegmentBuilder *)0x0;
    pCVar15 = (CapTableBuilder *)0x0;
    (**(code **)*pWVar21)
              (pWVar21,pSVar11,1,pCVar16,pCVar16,0,uVar6,pSVar9,pCVar20,puVar12,pWVar22,uVar14);
  }
  sVar1 = local_628.branches.size_;
  pBVar2 = local_628.branches.ptr;
  if (local_628.branches.ptr != (Branch *)0x0) {
    local_628.branches.ptr = (Branch *)0x0;
    local_628.branches.size_ = 0;
    (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
              (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar1 = local_628.text.content.size_;
  pcVar7 = local_628.text.content.ptr;
  if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
    local_628.text.content.ptr = (char *)0x0;
    local_628.text.content.size_ = 0;
    (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
              (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
  }
  if ((local_588 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_418 = local_578.segment;
    pCStack_410 = local_578.capTable;
    puStack_408 = (undefined2 *)local_578.data;
    pWStack_400 = local_578.pointers;
    local_3f8 = local_578.dataSize;
    SStack_3f4 = local_578.pointerCount;
    uStack_3f2 = local_578._38_2_;
    local_420 = 0x6c0ee0;
    value_14.builder.segment = (SegmentBuilder *)pWVar21;
    value_14.schema.super_Schema.raw = (Schema)(Schema)pCVar15;
    value_14.builder.capTable = (CapTableBuilder *)pWVar17;
    value_14.builder.data = local_598;
    value_14.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
    value_14.builder._32_8_ = pSVar18;
    pCVar20 = local_578.capTable;
    puVar12 = (undefined2 *)local_578.data;
    pWVar22 = local_578.pointers;
    uVar14 = local_578._32_8_;
    prettyPrint(value_14);
    pSVar10 = (String *)&local_5e8;
    kj::StringTree::flatten(pSVar10,&local_628);
    pcVar7 = "( un = (\n    struct = (someText = \"foo\") ) )";
    kj::_::Debug::
    log<char_const(&)[105],kj::_::DebugComparison<char_const(&)[45],kj::String>&,char_const(&)[45],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x239,ERROR,
               "\"failed: expected \" \"(\\\"( un = (\\\\n\\\" \\\"    struct = (someText = \\\\\\\"foo\\\\\\\") ) )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( un = (\\n\" \"    struct = (someText = \\\"foo\\\") ) )\", prettyPrint(root).flatten()"
               ,(char (*) [105])
                "failed: expected (\"( un = (\\n\" \"    struct = (someText = \\\"foo\\\") ) )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[45],_kj::String> *)&stack0xfffffffffffffa48,
               (char (*) [45])"( un = (\n    struct = (someText = \"foo\") ) )",pSVar10);
    pSVar11 = local_5e8;
    if (local_5e8 != (SegmentBuilder *)0x0) {
      local_5e8 = (SegmentBuilder *)0x0;
      pCVar16 = (CapTableBuilder *)0x0;
      (**(code **)*pWVar21)
                (pWVar21,pSVar11,1,pCVar15,pCVar15,0,pcVar7,pSVar10,pCVar20,puVar12,pWVar22,uVar14);
      pCVar15 = pCVar16;
    }
    sVar1 = local_628.branches.size_;
    pBVar2 = local_628.branches.ptr;
    if (local_628.branches.ptr != (Branch *)0x0) {
      local_628.branches.ptr = (Branch *)0x0;
      local_628.branches.size_ = 0;
      (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
                (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar1 = local_628.text.content.size_;
    pcVar7 = local_628.text.content.ptr;
    if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
      local_628.text.content.ptr = (char *)0x0;
      local_628.text.content.size_ = 0;
      (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
                (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
    }
  }
  if (pCVar19 != (CapTableBuilder *)0x0) {
    (**(code **)*pWVar24)(pWVar24,pCVar19,1,pWVar23,pWVar23,0);
  }
  pWVar23 = (WirePointer *)(local_528._24_8_ + 8);
  value_27.super_StringPtr.content.size_ = 0x21;
  value_27.super_StringPtr.content.ptr = "baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&stack0xfffffffffffffa48,value_27);
  local_548.content.ptr =
       "( un = (\n    struct = (\n      someText = \"foo\",\n      moreText = \"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\" ) ) )"
  ;
  pSStack_448 = local_578.segment;
  pCStack_440 = local_578.capTable;
  puStack_438 = (undefined2 *)local_578.data;
  pWStack_430 = local_578.pointers;
  local_428 = local_578.dataSize;
  SStack_424 = local_578.pointerCount;
  uStack_422 = local_578._38_2_;
  local_450 = 0x6c0ee0;
  uVar6 = 0x6c0ee0;
  value_15.builder.segment = (SegmentBuilder *)pWVar21;
  value_15.schema.super_Schema.raw = (Schema)(Schema)pCVar15;
  value_15.builder.capTable = (CapTableBuilder *)pWVar17;
  value_15.builder.data = local_598;
  value_15.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
  value_15.builder._32_8_ = local_528._0_8_;
  pSVar9 = local_578.segment;
  pCVar20 = local_578.capTable;
  puVar12 = (undefined2 *)local_578.data;
  pWVar22 = local_578.pointers;
  uVar14 = local_578._32_8_;
  prettyPrint(value_15);
  kj::StringTree::flatten((String *)&local_5e8,&local_628);
  kj::_::DebugExpression<char_const(&)[106]>::operator==
            ((DebugComparison<const_char_(&)[106],_kj::String> *)&stack0xfffffffffffffa48,
             (DebugExpression<char_const(&)[106]> *)&local_548,(String *)&local_5e8);
  pSVar11 = local_5e8;
  pCVar16 = pCVar15;
  pSVar18 = (SegmentBuilder *)local_528._0_8_;
  pCVar19 = (CapTableBuilder *)local_528._8_8_;
  if (local_5e8 != (SegmentBuilder *)0x0) {
    local_5e8 = (SegmentBuilder *)0x0;
    pCVar16 = (CapTableBuilder *)0x0;
    (**(code **)*pWVar21)
              (pWVar21,pSVar11,1,pCVar15,pCVar15,0,uVar6,pSVar9,pCVar20,puVar12,pWVar22,uVar14);
    pSVar18 = (SegmentBuilder *)local_528._0_8_;
    pCVar19 = (CapTableBuilder *)local_528._8_8_;
  }
  sVar1 = local_628.branches.size_;
  pBVar2 = local_628.branches.ptr;
  if (local_628.branches.ptr != (Branch *)0x0) {
    local_628.branches.ptr = (Branch *)0x0;
    local_628.branches.size_ = 0;
    (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
              (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar1 = local_628.text.content.size_;
  pcVar7 = local_628.text.content.ptr;
  if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
    local_628.text.content.ptr = (char *)0x0;
    local_628.text.content.size_ = 0;
    (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
              (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
  }
  if ((local_588 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_478 = local_578.segment;
    pCStack_470 = local_578.capTable;
    puStack_468 = (undefined2 *)local_578.data;
    pWStack_460 = local_578.pointers;
    local_458 = local_578.dataSize;
    SStack_454 = local_578.pointerCount;
    uStack_452 = local_578._38_2_;
    local_480 = 0x6c0ee0;
    value_16.builder.segment = (SegmentBuilder *)pWVar21;
    value_16.schema.super_Schema.raw = (Schema)(Schema)pCVar16;
    value_16.builder.capTable = (CapTableBuilder *)pWVar17;
    value_16.builder.data = local_598;
    value_16.builder.pointers = (WirePointer *)in_stack_fffffffffffffa40;
    value_16.builder._32_8_ = pSVar18;
    prettyPrint(value_16);
    pSVar10 = (String *)&local_5e8;
    kj::StringTree::flatten(pSVar10,&local_628);
    pcVar7 = 
    "( un = (\n    struct = (\n      someText = \"foo\",\n      moreText = \"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\" ) ) )"
    ;
    kj::_::Debug::
    log<char_const(&)[176],kj::_::DebugComparison<char_const(&)[106],kj::String>&,char_const(&)[106],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(\\\"( un = (\\\\n\\\" \\\"    struct = (\\\\n\\\" \\\"      someText = \\\\\\\"foo\\\\\\\",\\\\n\\\" \\\"      moreText = \\\\\\\"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\\\\\\\" ) ) )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( un = (\\n\" \"    struct = (\\n\" \"      someText = \\\"foo\\\",\\n\" \"      moreText = \\\"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\\\" ) ) )\", prettyPrint(root).flatten()"
               ,(char (*) [176])
                "failed: expected (\"( un = (\\n\" \"    struct = (\\n\" \"      someText = \\\"foo\\\",\\n\" \"      moreText = \\\"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\\\" ) ) )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[106],_kj::String> *)&stack0xfffffffffffffa48,
               (char (*) [106])
               "( un = (\n    struct = (\n      someText = \"foo\",\n      moreText = \"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\" ) ) )"
               ,pSVar10);
    pSVar11 = local_5e8;
    if (local_5e8 != (SegmentBuilder *)0x0) {
      local_5e8 = (SegmentBuilder *)0x0;
      (**(code **)*pWVar21)
                (pWVar21,pSVar11,1,pCVar16,pCVar16,0,pcVar7,pSVar10,local_578.capTable,
                 local_578.data,local_578.pointers,local_578._32_8_);
    }
    sVar1 = local_628.branches.size_;
    pBVar2 = local_628.branches.ptr;
    if (local_628.branches.ptr != (Branch *)0x0) {
      local_628.branches.ptr = (Branch *)0x0;
      local_628.branches.size_ = 0;
      (**(local_628.branches.disposer)->_vptr_ArrayDisposer)
                (local_628.branches.disposer,pBVar2,0x40,sVar1,sVar1,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar1 = local_628.text.content.size_;
    pcVar7 = local_628.text.content.ptr;
    if ((CapTableBuilder *)local_628.text.content.ptr != (CapTableBuilder *)0x0) {
      local_628.text.content.ptr = (char *)0x0;
      local_628.text.content.size_ = 0;
      (**(local_628.text.content.disposer)->_vptr_ArrayDisposer)
                (local_628.text.content.disposer,pcVar7,1,sVar1,sVar1,0);
    }
  }
  if (pCVar19 != (CapTableBuilder *)0x0) {
    (**(code **)*pWVar24)(pWVar24,pCVar19,1,pWVar23,pWVar23,0);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(Stringify, PrettyPrintAdvanced) {
  MallocMessageBuilder builder;

  {
    auto root = builder.initRoot<test::TestPrintInlineStructs>();

    auto list = root.initStructList(3);
    list[0].setInt32Field(123);
    list[0].setTextField("foo");
    list[1].setInt32Field(456);
    list[1].setTextField("bar");
    list[2].setInt32Field(789);
    list[2].setTextField("baz");

    EXPECT_EQ(
        "( structList = [\n"
        "    (int32Field = 123, textField = \"foo\"),\n"
        "    (int32Field = 456, textField = \"bar\"),\n"
        "    (int32Field = 789, textField = \"baz\") ] )",
        prettyPrint(root).flatten());

    root.setSomeText("foo");

    EXPECT_EQ(
        "( someText = \"foo\",\n"
        "  structList = [\n"
        "    (int32Field = 123, textField = \"foo\"),\n"
        "    (int32Field = 456, textField = \"bar\"),\n"
        "    (int32Field = 789, textField = \"baz\") ] )",
        prettyPrint(root).flatten());
  }

  {
    auto root = builder.initRoot<test::TestLists>();
    auto ll = root.initInt32ListList(3);
    ll.set(0, {123, 456, 789, 1234567890});
    ll.set(1, {234, 567, 891, 1234567890});
    ll.set(2, {345, 678, 912, 1234567890});

    EXPECT_EQ(
        "[ [123, 456, 789, 1234567890],\n"
        "  [234, 567, 891, 1234567890],\n"
        "  [345, 678, 912, 1234567890] ]",
        prettyPrint(ll).flatten());

    EXPECT_EQ(
        "( int32ListList = [\n"
        "    [123, 456, 789, 1234567890],\n"
        "    [234, 567, 891, 1234567890],\n"
        "    [345, 678, 912, 1234567890] ] )",
        prettyPrint(root).flatten());

    root.initList8(0);

    EXPECT_EQ(
        "( list8 = [],\n"
        "  int32ListList = [\n"
        "    [123, 456, 789, 1234567890],\n"
        "    [234, 567, 891, 1234567890],\n"
        "    [345, 678, 912, 1234567890] ] )",
        prettyPrint(root).flatten());

    auto l8 = root.initList8(1);
    l8[0].setF(12);

    EXPECT_EQ(
        "( list8 = [(f = 12)],\n"
        "  int32ListList = [\n"
        "    [123, 456, 789, 1234567890],\n"
        "    [234, 567, 891, 1234567890],\n"
        "    [345, 678, 912, 1234567890] ] )",
        prettyPrint(root).flatten());

    l8 = root.initList8(2);
    l8[0].setF(12);
    l8[1].setF(34);

    EXPECT_EQ(
        "( list8 = [(f = 12), (f = 34)],\n"
        "  int32ListList = [\n"
        "    [123, 456, 789, 1234567890],\n"
        "    [234, 567, 891, 1234567890],\n"
        "    [345, 678, 912, 1234567890] ] )",
        prettyPrint(root).flatten());
  }

  {
    auto root = builder.initRoot<test::TestStructUnion>();

    auto s = root.getUn().initStruct();
    EXPECT_EQ(
        "(un = (struct = ()))",
        prettyPrint(root).flatten());

    s.setSomeText("foo");
    EXPECT_EQ(
        "( un = (\n"
        "    struct = (someText = \"foo\") ) )",
        prettyPrint(root).flatten());

    s.setMoreText("baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar");
    EXPECT_EQ(
        "( un = (\n"
        "    struct = (\n"
        "      someText = \"foo\",\n"
        "      moreText = \"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\" ) ) )",
        prettyPrint(root).flatten());
  }
}